

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

bool __thiscall HighsLp::equalButForScalingAndNames(HighsLp *this,HighsLp *lp)

{
  double *pdVar1;
  pointer piVar2;
  __type _Var3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  HighsSparseMatrix *in_RDI;
  undefined1 uVar10;
  bool equal_matrix;
  bool equal_vectors;
  bool local_2a;
  byte local_29;
  byte bVar11;
  byte bVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  
  uVar10 = in_RDI->format_ == *(MatrixFormat *)in_RSI;
  uVar14 = in_RDI->num_col_ == *(int *)&in_RSI->field_0x4 && (bool)uVar10;
  uVar13 = *(int *)&in_RDI[2].start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == *(int *)&in_RSI[7].field_2 && (bool)uVar14;
  piVar2 = in_RDI[2].start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = (double *)((long)&in_RSI[7].field_2 + 8);
  bVar12 = false;
  if (((double)piVar2 == *pdVar1) && (!NAN((double)piVar2) && !NAN(*pdVar1))) {
    bVar12 = uVar13;
  }
  bVar11 = bVar12;
  _Var3 = std::operator==(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(bVar12,CONCAT16(in_stack_ffffffffffffffee,
                                                             CONCAT15(uVar10,
                                                  in_stack_ffffffffffffffe8))));
  if (!_Var3) {
    bVar11 = 0;
  }
  bVar4 = bVar11 & 1;
  bVar5 = std::operator==((vector<double,_std::allocator<double>_> *)in_RSI,
                          (vector<double,_std::allocator<double>_> *)
                          (CONCAT17(bVar11,CONCAT16(in_stack_ffffffffffffffee,
                                                    CONCAT15(uVar10,in_stack_ffffffffffffffe8))) &
                          0x1ffffffffffffff));
  if (!bVar5) {
    bVar4 = 0;
  }
  bVar6 = bVar4 & 1;
  bVar5 = std::operator==((vector<double,_std::allocator<double>_> *)in_RSI,
                          (vector<double,_std::allocator<double>_> *)
                          (CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffffee,
                                                   CONCAT15(uVar10,in_stack_ffffffffffffffe8))) &
                          0x1ffffffffffffff));
  if (!bVar5) {
    bVar6 = 0;
  }
  bVar7 = bVar6 & 1;
  bVar5 = std::operator==((vector<double,_std::allocator<double>_> *)in_RSI,
                          (vector<double,_std::allocator<double>_> *)
                          (CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffffee,
                                                   CONCAT15(uVar10,in_stack_ffffffffffffffe8))) &
                          0x1ffffffffffffff));
  if (!bVar5) {
    bVar7 = 0;
  }
  bVar8 = bVar7 & 1;
  bVar5 = std::operator==((vector<double,_std::allocator<double>_> *)in_RSI,
                          (vector<double,_std::allocator<double>_> *)
                          (CONCAT17(bVar7,CONCAT16(in_stack_ffffffffffffffee,
                                                   CONCAT15(uVar10,in_stack_ffffffffffffffe8))) &
                          0x1ffffffffffffff));
  if (!bVar5) {
    bVar8 = 0;
  }
  bVar9 = bVar8 & 1;
  bVar5 = std::operator==((vector<double,_std::allocator<double>_> *)in_RSI,
                          (vector<double,_std::allocator<double>_> *)
                          (CONCAT17(bVar8,CONCAT16(in_stack_ffffffffffffffee,
                                                   CONCAT15(uVar10,in_stack_ffffffffffffffe8))) &
                          0x1ffffffffffffff));
  local_29 = 0;
  if (!bVar5) {
    bVar9 = local_29;
  }
  local_29 = bVar9;
  local_29 = local_29 & 1;
  bVar5 = HighsSparseMatrix::operator==
                    (in_RDI,(HighsSparseMatrix *)
                            CONCAT17(uVar14,CONCAT16(uVar13,CONCAT15(bVar12,CONCAT14(bVar11,CONCAT13
                                                  (bVar4,CONCAT12(bVar6,CONCAT11(bVar7,bVar8))))))))
  ;
  local_2a = false;
  if ((local_29 & 1) != 0) {
    local_2a = bVar5;
  }
  return local_2a;
}

Assistant:

bool HighsLp::equalButForScalingAndNames(const HighsLp& lp) const {
  bool equal_vectors = true;
  equal_vectors = this->num_col_ == lp.num_col_ && equal_vectors;
  equal_vectors = this->num_row_ == lp.num_row_ && equal_vectors;
  equal_vectors = this->sense_ == lp.sense_ && equal_vectors;
  equal_vectors = this->offset_ == lp.offset_ && equal_vectors;
  equal_vectors = this->model_name_ == lp.model_name_ && equal_vectors;
  equal_vectors = this->col_cost_ == lp.col_cost_ && equal_vectors;
  equal_vectors = this->col_upper_ == lp.col_upper_ && equal_vectors;
  equal_vectors = this->col_lower_ == lp.col_lower_ && equal_vectors;
  equal_vectors = this->row_upper_ == lp.row_upper_ && equal_vectors;
  equal_vectors = this->row_lower_ == lp.row_lower_ && equal_vectors;
#ifndef NDEBUG
  if (!equal_vectors) printf("HighsLp::equalButForNames: Unequal vectors\n");
#endif
  const bool equal_matrix = this->a_matrix_ == lp.a_matrix_;
#ifndef NDEBUG
  if (!equal_matrix) printf("HighsLp::equalButForNames: Unequal matrix\n");
#endif
  return equal_vectors && equal_matrix;
}